

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffpbyt(fitsfile *fptr,LONGLONG nbytes,void *buffer,int *status)

{
  LONGLONG *pLVar1;
  long lVar2;
  FITSfile *pFVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  long lVar9;
  long local_38;
  
  if (0 < *status) {
    return *status;
  }
  pFVar3 = fptr->Fptr;
  if (fptr->HDUposition != pFVar3->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar3 = fptr->Fptr;
  }
  if (pFVar3->curbuf < 0) {
    ffldrc(fptr,pFVar3->bytepos / 0xb40,0,status);
  }
  if (nbytes < 0x21c0) {
    if (nbytes != 0) {
      pFVar3 = fptr->Fptr;
      lVar5 = pFVar3->bufrecnum[pFVar3->curbuf] * -0xb40 + pFVar3->bytepos;
      sVar8 = 0xb40 - lVar5;
      while( true ) {
        if (nbytes < (long)sVar8) {
          sVar8 = nbytes;
        }
        memcpy(fptr->Fptr->iobuffer + lVar5 + (long)fptr->Fptr->curbuf * 0xb40,buffer,sVar8);
        pFVar3 = fptr->Fptr;
        lVar5 = pFVar3->bytepos + sVar8;
        pFVar3->bytepos = lVar5;
        pFVar3->dirty[pFVar3->curbuf] = 1;
        nbytes = nbytes - sVar8;
        if (nbytes == 0) break;
        buffer = (void *)((long)buffer + sVar8);
        ffldrc(fptr,lVar5 / 0xb40,1,status);
        sVar8 = 0xb40;
        lVar5 = 0;
      }
    }
  }
  else {
    pFVar3 = fptr->Fptr;
    iVar6 = pFVar3->curbuf;
    lVar7 = (long)iVar6;
    local_38 = pFVar3->bytepos;
    lVar5 = pFVar3->bufrecnum[lVar7];
    lVar2 = (nbytes + local_38 + -1) / 0xb40;
    lVar4 = lVar5 * -0xb40 + local_38;
    if (lVar4 != 0xb40) {
      sVar8 = 0xb40 - lVar4;
      memcpy(pFVar3->iobuffer + lVar4 + iVar6 * 0xb40,buffer,sVar8);
      nbytes = nbytes - sVar8;
      buffer = (void *)((long)buffer + sVar8);
      local_38 = local_38 + sVar8;
      pFVar3 = fptr->Fptr;
      pFVar3->dirty[lVar7] = 1;
    }
    lVar4 = 0;
    do {
      if ((lVar5 <= pFVar3->bufrecnum[lVar4]) && (pFVar3->bufrecnum[lVar4] <= lVar2)) {
        if (pFVar3->dirty[lVar4] != 0) {
          ffbfwt(pFVar3,(int)lVar4,status);
          pFVar3 = fptr->Fptr;
        }
        pFVar3->bufrecnum[lVar4] = -1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x28);
    if (pFVar3->io_pos != local_38) {
      ffseek(pFVar3,local_38);
      pFVar3 = fptr->Fptr;
    }
    lVar5 = (nbytes + -1) / 0xb40;
    lVar4 = lVar5 * 0xb40;
    ffwrite(pFVar3,lVar4,buffer,status);
    lVar9 = lVar4 + local_38;
    pFVar3 = fptr->Fptr;
    pFVar3->io_pos = lVar9;
    if (lVar9 < pFVar3->filesize) {
      lVar9 = (long)(iVar6 * 0xb40);
      ffread(pFVar3,0xb40,pFVar3->iobuffer + lVar9,status);
      pLVar1 = &fptr->Fptr->io_pos;
      *pLVar1 = *pLVar1 + 0xb40;
    }
    else {
      pFVar3->filesize = lVar9;
      lVar9 = lVar7 * 0xb40;
      if (pFVar3->hdutype == 1) {
        iVar6 = 0x20;
      }
      else {
        iVar6 = 0;
      }
      memset(pFVar3->iobuffer + lVar9,iVar6,0xb40);
    }
    memcpy(fptr->Fptr->iobuffer + lVar9,(void *)((long)buffer + lVar4),nbytes + lVar5 * -0xb40);
    pFVar3 = fptr->Fptr;
    pFVar3->dirty[lVar7] = 1;
    pFVar3->bufrecnum[lVar7] = lVar2;
    lVar5 = lVar2 * 0xb40 + 0xb40;
    if (lVar5 < pFVar3->logfilesize) {
      lVar5 = pFVar3->logfilesize;
    }
    pFVar3->logfilesize = lVar5;
    pFVar3->bytepos = nbytes + local_38;
  }
  return *status;
}

Assistant:

int ffpbyt(fitsfile *fptr,   /* I - FITS file pointer                    */
           LONGLONG nbytes,      /* I - number of bytes to write             */
           void *buffer,     /* I - buffer containing the bytes to write */
           int *status)      /* IO - error status                        */
/*
  put (write) the buffer of bytes to the output FITS file, starting at
  the current file position.  Write large blocks of data directly to disk;
  write smaller segments to intermediate IO buffers to improve efficiency.
*/
{
    int ii, nbuff;
    LONGLONG filepos;
    long recstart, recend;
    long ntodo, bufpos, nspace, nwrite;
    char *cptr;

    if (*status > 0)
       return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (nbytes > LONG_MAX) {
        ffpmsg("Number of bytes to write is greater than LONG_MAX (ffpbyt).");
        *status = WRITE_ERROR;
	return(*status);
    }
    
    ntodo =  (long) nbytes;
    cptr = (char *)buffer;

    if ((fptr->Fptr)->curbuf < 0)  /* no current data buffer for this file */
    {                              /* so reload the last one that was used */
      ffldrc(fptr, (long) (((fptr->Fptr)->bytepos) / IOBUFLEN), REPORT_EOF, status);
    }

    if (nbytes >= MINDIRECT)
    {
      /* write large blocks of data directly to disk instead of via buffers */
      /* first, fill up the current IO buffer before flushing it to disk */

      nbuff = (fptr->Fptr)->curbuf;      /* current IO buffer number */
      filepos = (fptr->Fptr)->bytepos;   /* save the write starting position */
      recstart = (fptr->Fptr)->bufrecnum[nbuff];                 /* starting record */
      recend = (long) ((filepos + nbytes - 1) / IOBUFLEN);  /* ending record   */

      /* bufpos is the starting position within the IO buffer */
      bufpos = (long) (filepos - ((LONGLONG)recstart * IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      if (nspace)
      { /* fill up the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN) + bufpos, cptr, nspace);
        ntodo -= nspace;           /* decrement remaining number of bytes */
        cptr += nspace;            /* increment user buffer pointer */
        filepos += nspace;         /* increment file position pointer */
        (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      }

      for (ii = 0; ii < NIOBUF; ii++) /* flush any affected buffers to disk */
      {
        if ((fptr->Fptr)->bufrecnum[ii] >= recstart
            && (fptr->Fptr)->bufrecnum[ii] <= recend )
        {
          if ((fptr->Fptr)->dirty[ii])        /* flush modified buffer to disk */
             ffbfwt(fptr->Fptr, ii, status);

          (fptr->Fptr)->bufrecnum[ii] = -1;  /* disassociate buffer from the file */
        }
      }

      /* move to the correct write position */
      if ((fptr->Fptr)->io_pos != filepos)
         ffseek(fptr->Fptr, filepos);

      nwrite = ((ntodo - 1) / IOBUFLEN) * IOBUFLEN; /* don't write last buff */

      ffwrite(fptr->Fptr, nwrite, cptr, status); /* write the data */
      ntodo -= nwrite;                /* decrement remaining number of bytes */
      cptr += nwrite;                  /* increment user buffer pointer */
      (fptr->Fptr)->io_pos = filepos + nwrite; /* update the file position */

      if ((fptr->Fptr)->io_pos >= (fptr->Fptr)->filesize) /* at the EOF? */
      {
        (fptr->Fptr)->filesize = (fptr->Fptr)->io_pos; /* increment file size */

        /* initialize the current buffer with the correct fill value */
        if ((fptr->Fptr)->hdutype == ASCII_TBL)
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), 32, IOBUFLEN);  /* blank fill */
        else
          memset((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN),  0, IOBUFLEN);  /* zero fill */
      }
      else
      {
        /* read next record */
        ffread(fptr->Fptr, IOBUFLEN, (fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), status);
        (fptr->Fptr)->io_pos += IOBUFLEN; 
      }

      /* copy remaining bytes from user buffer into current IO buffer */
      memcpy((fptr->Fptr)->iobuffer + (nbuff * IOBUFLEN), cptr, ntodo);
      (fptr->Fptr)->dirty[nbuff] = TRUE;       /* mark record as having been modified */
      (fptr->Fptr)->bufrecnum[nbuff] = recend; /* record number */

      (fptr->Fptr)->logfilesize = maxvalue((fptr->Fptr)->logfilesize, 
                                       (LONGLONG)(recend + 1) * IOBUFLEN);
      (fptr->Fptr)->bytepos = filepos + nwrite + ntodo;
    }
    else
    {
      /* bufpos is the starting position in IO buffer */
      bufpos = (long) ((fptr->Fptr)->bytepos - ((LONGLONG)(fptr->Fptr)->bufrecnum[(fptr->Fptr)->curbuf] *
               IOBUFLEN));
      nspace = IOBUFLEN - bufpos;   /* amount of space left in the buffer */

      while (ntodo)
      {
        nwrite = minvalue(ntodo, nspace);

        /* copy bytes from user's buffer to the IO buffer */
        memcpy((fptr->Fptr)->iobuffer + ((fptr->Fptr)->curbuf * IOBUFLEN) + bufpos, cptr, nwrite);
        ntodo -= nwrite;            /* decrement remaining number of bytes */
        cptr += nwrite;
        (fptr->Fptr)->bytepos += nwrite;  /* increment file position pointer */
        (fptr->Fptr)->dirty[(fptr->Fptr)->curbuf] = TRUE; /* mark record as modified */

        if (ntodo)                  /* load next record into a buffer */
        {
          ffldrc(fptr, (long) ((fptr->Fptr)->bytepos / IOBUFLEN), IGNORE_EOF, status);
          bufpos = 0;
          nspace = IOBUFLEN;
        }
      }
    }
    return(*status);
}